

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void phys_page_compact(uc_struct_conflict15 *uc,PhysPageEntry *lp,Node *nodes)

{
  uc_arch uVar1;
  ulong uVar2;
  uc_arch uVar3;
  Node *extraout_RDX;
  int iVar4;
  uint uVar5;
  uc_struct_conflict15 *puVar6;
  ulong uVar7;
  uc_struct_conflict15 *uc_00;
  
  uVar5 = uc->arch >> 6;
  if (uVar5 != 0x3ffffff) {
    puVar6 = (uc_struct_conflict15 *)(lp + (ulong)uVar5 * 0x200);
    uVar7 = 0;
    uVar2 = 0x200;
    iVar4 = 0;
    uc_00 = puVar6;
    do {
      if (uc_00->arch < 0xffffffc0) {
        iVar4 = iVar4 + 1;
        if ((uc_00->arch & 0x3f) != 0) {
          phys_page_compact(uc_00,lp,nodes);
          nodes = extraout_RDX;
        }
        uVar2 = uVar7 & 0xffffffff;
      }
      uVar7 = uVar7 + 1;
      uc_00 = (uc_struct_conflict15 *)&uc_00->mode;
    } while (uVar7 != 0x200);
    if (iVar4 == 1) {
      if (0x1ff < (uint)uVar2) {
        __assert_fail("valid_ptr < P_L2_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                      ,0xd7,"void phys_page_compact(struct uc_struct *, PhysPageEntry *, Node *)");
      }
      uVar3 = (&puVar6->arch)[uVar2] & 0xffffffc0;
      uVar1 = uc->arch;
      uc->arch = uVar1 & 0x3f | uVar3;
      uVar1 = (&puVar6->arch)[uVar2] + uVar1 & 0x3f;
      if (((&puVar6->arch)[uVar2] & 0x3f) == 0) {
        uVar1 = 0;
      }
      uc->arch = uVar1 | uVar3;
    }
  }
  return;
}

Assistant:

static void phys_page_compact(struct uc_struct *uc, PhysPageEntry *lp, Node *nodes)
{
    unsigned valid_ptr = P_L2_SIZE;
    int valid = 0;
    PhysPageEntry *p;
    int i;

    if (lp->ptr == PHYS_MAP_NODE_NIL) {
        return;
    }

    p = nodes[lp->ptr];
    for (i = 0; i < P_L2_SIZE; i++) {
        if (p[i].ptr == PHYS_MAP_NODE_NIL) {
            continue;
        }

        valid_ptr = i;
        valid++;
        if (p[i].skip) {
            phys_page_compact(uc, &p[i], nodes);
        }
    }

    /* We can only compress if there's only one child. */
    if (valid != 1) {
        return;
    }

    assert(valid_ptr < P_L2_SIZE);

    /* Don't compress if it won't fit in the # of bits we have. */
    if (P_L2_LEVELS >= (1 << 6) &&
        lp->skip + p[valid_ptr].skip >= (1 << 6)) {
        return;
    }

    lp->ptr = p[valid_ptr].ptr;
    if (!p[valid_ptr].skip) {
        /* If our only child is a leaf, make this a leaf. */
        /* By design, we should have made this node a leaf to begin with so we
         * should never reach here.
         * But since it's so simple to handle this, let's do it just in case we
         * change this rule.
         */
        lp->skip = 0;
    } else {
        lp->skip += p[valid_ptr].skip;
    }
}